

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::xml_document::save
          (xml_document *this,xml_writer *writer,char_t *indent,uint flags,xml_encoding encoding)

{
  xml_node_struct *pxVar1;
  xml_node_struct **ppxVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  undefined8 uVar4;
  size_t __n;
  void *__buf;
  bool bVar5;
  xml_buffered_writer buffered_writer;
  
  uVar4 = CONCAT44(in_register_0000000c,flags);
  impl::anon_unknown_0::xml_buffered_writer::xml_buffered_writer(&buffered_writer,writer,encoding);
  bVar5 = (flags & 2) == 0;
  __n = CONCAT71((int7)((ulong)uVar4 >> 8),encoding == encoding_latin1 || bVar5);
  if (encoding != encoding_latin1 && !bVar5) {
    __n = 0xbf;
    impl::anon_unknown_0::xml_buffered_writer::write(&buffered_writer,0xef,(void *)0xbb,0xbf);
  }
  if ((flags & 8) == 0) {
    ppxVar2 = &((this->super_xml_node)._root)->first_child;
    while (pxVar1 = *ppxVar2, pxVar1 != (xml_node_struct *)0x0) {
      uVar3 = (uint)pxVar1->header & 0xf;
      __n = (size_t)uVar3;
      if (uVar3 == 2) break;
      if (uVar3 == 7) goto LAB_0010913a;
      ppxVar2 = &pxVar1->next_sibling;
    }
    impl::anon_unknown_0::xml_buffered_writer::write_string
              (&buffered_writer,(char_t *)"<?xml version=\"1.0\"");
    if (encoding == encoding_latin1) {
      impl::anon_unknown_0::xml_buffered_writer::write_string
                (&buffered_writer,(char_t *)" encoding=\"ISO-8859-1\"");
    }
    impl::anon_unknown_0::xml_buffered_writer::write(&buffered_writer,0x3f,(void *)0x3e,__n);
    if ((flags & 4) == 0) {
      impl::anon_unknown_0::xml_buffered_writer::write(&buffered_writer,10,__buf,__n);
    }
  }
LAB_0010913a:
  impl::anon_unknown_0::node_output(&buffered_writer,(this->super_xml_node)._root,indent,flags,0);
  impl::anon_unknown_0::xml_buffered_writer::flush(&buffered_writer);
  return;
}

Assistant:

PUGI__FN void xml_document::save(xml_writer& writer, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		impl::xml_buffered_writer buffered_writer(writer, encoding);

		if ((flags & format_write_bom) && encoding != encoding_latin1)
		{
			// BOM always represents the codepoint U+FEFF, so just write it in native encoding
		#ifdef PUGIXML_WCHAR_MODE
			unsigned int bom = 0xfeff;
			buffered_writer.write(static_cast<wchar_t>(bom));
		#else
			buffered_writer.write('\xef', '\xbb', '\xbf');
		#endif
		}

		if (!(flags & format_no_declaration) && !impl::has_declaration(_root))
		{
			buffered_writer.write_string(PUGIXML_TEXT("<?xml version=\"1.0\""));
			if (encoding == encoding_latin1) buffered_writer.write_string(PUGIXML_TEXT(" encoding=\"ISO-8859-1\""));
			buffered_writer.write('?', '>');
			if (!(flags & format_raw)) buffered_writer.write('\n');
		}

		impl::node_output(buffered_writer, _root, indent, flags, 0);

		buffered_writer.flush();
	}